

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opn_chip_family.h
# Opt level: O1

uint32_t __thiscall
OPNChipBaseT<NP2OPNA<FM::OPNA>_>::nativeRate(OPNChipBaseT<NP2OPNA<FM::OPNA>_> *this)

{
  uint32_t uVar1;
  
  uVar1 = 0xd013;
  if ((this->super_OPNChipBase).m_family == OPNChip_OPNA) {
    uVar1 = 0xd8aa;
  }
  return uVar1;
}

Assistant:

inline uint32_t opn2_getNativeRate(OPNFamily f)
{
    switch(f)
    {
    default:
    #define Each(x) case OPNChip_##x: \
        return OPNFamilyTraits<OPNChip_##x>::nativeRate;
    OPN_FAMILY_EACH(Each)
    #undef Each
    }
}